

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_xdr.h
# Opt level: O0

float one_from_native_float(float v)

{
  float fVar1;
  anon_union_4_2_947300a4 coerce;
  
  fVar1 = (float)one_from_native32(0);
  return fVar1;
}

Assistant:

static inline float
one_from_native_float (float v)
{
    union
    {
        uint32_t i;
        float    f;
    } coerce;
    coerce.f = v;
    coerce.i = one_from_native32 (coerce.i);
    return coerce.f;
}